

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.hpp
# Opt level: O1

Node<int> * __thiscall Node<int>::createNewNext(Node<int> *this)

{
  Node<int> *this_00;
  
  this_00 = (Node<int> *)operator_new(0x40);
  Node(this_00,false);
  this_00->next = this->next;
  this->next = this_00;
  return this_00;
}

Assistant:

Node<T> *createNewNext() {
        Node *node = new Node<T>(false);
        node->next = next;
        next = node;

        return node;
    }